

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal.cpp
# Opt level: O0

void __thiscall LiteScript::Class::Inherit(Class *this,Variable *v)

{
  bool bVar1;
  Object *pOVar2;
  Type *this_00;
  size_type sVar3;
  char *pcVar4;
  const_reference pvVar5;
  uint local_48;
  uint sz_1;
  uint i_1;
  uint sz;
  uint i;
  Variable local_30;
  Class *local_20;
  Class *C;
  Variable *v_local;
  Class *this_local;
  
  C = (Class *)v;
  v_local = (Variable *)this;
  pOVar2 = Variable::operator->(v);
  this_00 = Object::GetType(pOVar2);
  bVar1 = Type::operator!=(this_00,(Type *)_type_class);
  if (!bVar1) {
    pOVar2 = Variable::operator->((Variable *)C);
    local_20 = Object::GetData<LiteScript::Class>(pOVar2);
    if (this != local_20) {
      Variable::Variable(&local_30,(Variable *)C);
      std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>::push_back
                (&this->inherit,&local_30);
      Variable::~Variable(&local_30);
      i_1 = 0;
      sVar3 = std::
              vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable>_>_>
              ::size(&local_20->s_members);
      for (; i_1 < (uint)sVar3; i_1 = i_1 + 1) {
        std::
        vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable>_>_>
        ::operator[](&local_20->s_members,(ulong)i_1);
        pcVar4 = (char *)std::__cxx11::string::c_str();
        pvVar5 = std::
                 vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable>_>_>
                 ::operator[](&local_20->s_members,(ulong)i_1);
        AddStatic(this,pcVar4,&pvVar5->second);
      }
      local_48 = 0;
      sVar3 = std::
              vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable>_>_>
              ::size(&local_20->us_members);
      for (; local_48 < (uint)sVar3; local_48 = local_48 + 1) {
        std::
        vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable>_>_>
        ::operator[](&local_20->us_members,(ulong)local_48);
        pcVar4 = (char *)std::__cxx11::string::c_str();
        pvVar5 = std::
                 vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable>_>_>
                 ::operator[](&local_20->us_members,(ulong)local_48);
        AddUnstatic(this,pcVar4,&pvVar5->second);
      }
    }
  }
  return;
}

Assistant:

void LiteScript::Class::Inherit(const Variable &v) {
    if (v->GetType() != Type::CLASS)
        return;
    const Class& C = v->GetData<Class>();
    if (this == &C)
        return;
    this->inherit.push_back(Variable(v));
    for (unsigned int i = 0, sz = C.s_members.size(); i < sz; i++)
        this->AddStatic(C.s_members[i].first.c_str(), C.s_members[i].second);
    for (unsigned int i = 0, sz = C.us_members.size(); i < sz; i++)
        this->AddUnstatic(C.us_members[i].first.c_str(), C.us_members[i].second);
}